

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O1

void __thiscall vec<Lit>::growTo(vec<Lit> *this,uint size)

{
  Lit *pLVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  int iVar9;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  int iVar12;
  undefined1 auVar11 [16];
  
  if (this->sz < size) {
    reserve(this,size);
    auVar4 = _DAT_001db190;
    auVar3 = _DAT_001d7970;
    auVar2 = _DAT_001d7960;
    uVar5 = (ulong)this->sz;
    if (this->sz < size) {
      pLVar1 = this->data;
      lVar7 = (size - uVar5) + -1;
      auVar8._8_4_ = (int)lVar7;
      auVar8._0_8_ = lVar7;
      auVar8._12_4_ = (int)((ulong)lVar7 >> 0x20);
      uVar6 = 0;
      auVar8 = auVar8 ^ _DAT_001d7970;
      do {
        auVar10._8_4_ = (int)uVar6;
        auVar10._0_8_ = uVar6;
        auVar10._12_4_ = (int)(uVar6 >> 0x20);
        auVar11 = (auVar10 | auVar2) ^ auVar3;
        iVar9 = auVar8._4_4_;
        if ((bool)(~(auVar11._4_4_ == iVar9 && auVar8._0_4_ < auVar11._0_4_ || iVar9 < auVar11._4_4_
                    ) & 1)) {
          pLVar1[uVar5 + uVar6].x = -2;
        }
        if ((auVar11._12_4_ != auVar8._12_4_ || auVar11._8_4_ <= auVar8._8_4_) &&
            auVar11._12_4_ <= auVar8._12_4_) {
          pLVar1[uVar5 + uVar6 + 1].x = -2;
        }
        auVar10 = (auVar10 | auVar4) ^ auVar3;
        iVar12 = auVar10._4_4_;
        if (iVar12 <= iVar9 && (iVar12 != iVar9 || auVar10._0_4_ <= auVar8._0_4_)) {
          pLVar1[uVar5 + uVar6 + 2].x = -2;
          pLVar1[uVar5 + uVar6 + 3].x = -2;
        }
        uVar6 = uVar6 + 4;
      } while (((size - uVar5) + 3 & 0xfffffffffffffffc) != uVar6);
    }
    this->sz = size;
  }
  return;
}

Assistant:

void growTo(unsigned int size) {
		if (size <= sz) {
			return;
		}
		reserve(size);
		for (unsigned int i = sz; i < size; i++) {
			new (&data[i]) T();
		}
		sz = size;
	}